

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateIndexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  ulong uVar1;
  uint8_t uVar2;
  uint uVar3;
  ulong *puVar4;
  byte *ptr_00;
  byte *pbVar5;
  ulong uVar6;
  Exception *this_00;
  byte bVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  char *msg;
  byte *pbVar12;
  long lVar13;
  ulong uVar14;
  byte *local_38;
  
  uVar2 = *ptr;
  bVar7 = uVar2 - 6;
  lVar13 = 1L << (bVar7 & 0x3f);
  validateBufferLength(this,(2L << (bVar7 & 0x3f)) + 2,length,true);
  puVar4 = (ulong *)(ptr + 1);
  uVar1 = lVar13 - 1;
  switch(uVar1) {
  case 0:
    uVar14 = (ulong)(byte)*puVar4;
    break;
  case 1:
    uVar14 = (ulong)*(ushort *)(ptr + 1);
    break;
  case 2:
    uVar9 = (ulong)((uint)ptr[2] << 8 | (uint)ptr[3] << 0x10);
    uVar14 = (ulong)ptr[1];
    goto LAB_00115342;
  case 3:
    uVar14 = (ulong)*(uint *)(ptr + 1);
    break;
  case 4:
    uVar3 = (uint)*puVar4;
    uVar14 = (ulong)ptr[5];
    goto LAB_00115325;
  case 5:
    uVar3 = (uint)*puVar4;
    uVar14 = (ulong)*(ushort *)(ptr + 5);
LAB_00115325:
    uVar14 = uVar14 << 0x20 | (ulong)uVar3;
    break;
  case 6:
    uVar9 = (ulong)*(uint3 *)(ptr + 5) << 0x20;
    uVar14 = (ulong)(uint)*puVar4;
LAB_00115342:
    uVar14 = uVar14 | uVar9;
    break;
  case 7:
    uVar14 = *puVar4;
    break;
  default:
    uVar14 = 0;
  }
  if (length < uVar14) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array length is out of bounds";
    goto LAB_00115688;
  }
  if (uVar2 == '\t') {
    if (uVar1 < 8) {
      uVar9 = *(ulong *)(ptr + (uVar14 - lVar13));
    }
    else {
      uVar9 = 0;
    }
    if (uVar9 == 0) goto LAB_001156c1;
    pbVar12 = (byte *)((long)(ptr + (uVar14 - lVar13)) - (uVar9 << (bVar7 & 0x3f)));
    if ((pbVar12 < ptr + lVar13) || (ptr + lVar13 * -2 + length < pbVar12)) goto LAB_001156d7;
    ptr_00 = (byte *)((long)puVar4 + lVar13);
    goto LAB_0011555b;
  }
  puVar4 = (ulong *)((long)puVar4 + lVar13);
  switch(uVar1) {
  case 0:
    uVar9 = (ulong)(byte)*puVar4;
    break;
  case 1:
    uVar9 = (ulong)(ushort)*puVar4;
    break;
  case 2:
    uVar6 = (ulong)((uint)*(byte *)((long)puVar4 + 1) << 8 |
                   (uint)*(byte *)((long)puVar4 + 2) << 0x10);
    uVar9 = (ulong)(byte)*puVar4;
    goto LAB_00115474;
  case 3:
    uVar9 = (ulong)(uint)*puVar4;
    break;
  case 4:
    uVar3 = (uint)*puVar4;
    uVar9 = (ulong)*(byte *)((long)puVar4 + 4);
    goto LAB_00115437;
  case 5:
    uVar3 = (uint)*puVar4;
    uVar9 = (ulong)*(ushort *)((long)puVar4 + 4);
LAB_00115437:
    uVar9 = uVar9 << 0x20 | (ulong)uVar3;
    break;
  case 6:
    uVar6 = (ulong)*(uint3 *)((long)puVar4 + 4) << 0x20;
    uVar9 = (ulong)(uint)*puVar4;
LAB_00115474:
    uVar9 = uVar9 | uVar6;
    break;
  case 7:
    uVar9 = *puVar4;
    break;
  default:
    uVar9 = 0;
  }
  if (uVar9 == 0) {
LAB_001156c1:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array nrItems value is invalid";
  }
  else {
    pbVar5 = (byte *)((long)puVar4 + lVar13);
    pbVar8 = pbVar5 + (-2L << (bVar7 & 0x3f)) + 8;
    pbVar12 = ptr + uVar14;
    ptr_00 = pbVar5;
    pbVar10 = pbVar8;
    if (pbVar12 < pbVar8) {
      pbVar10 = pbVar12;
    }
    for (; (ptr_00 < pbVar10 && (*ptr_00 == 0)); ptr_00 = ptr_00 + 1) {
    }
    if (ptr_00 == pbVar8 || ptr_00 == pbVar5) {
      pbVar12 = pbVar12 + -(uVar9 << (bVar7 & 0x3f));
      if (((pbVar12 < ptr + lVar13 * 2) || (pbVar12 < ptr_00)) ||
         (ptr + (length - lVar13) < pbVar12)) {
LAB_001156d7:
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array index table is out of bounds";
      }
      else {
LAB_0011555b:
        uVar14 = 0;
        for (; ptr_00 < pbVar12; ptr_00 = ptr_00 + uVar6) {
          validatePart(this,ptr_00,(long)pbVar12 - (long)ptr_00,true);
          lVar13 = uVar14 << (bVar7 & 0x3f);
          switch(uVar1) {
          case 0:
            uVar6 = (ulong)pbVar12[lVar13];
            break;
          case 1:
            uVar6 = (ulong)*(ushort *)(pbVar12 + lVar13);
            break;
          case 2:
            uVar11 = (ulong)((uint)pbVar12[lVar13 + 1] << 8 | (uint)pbVar12[lVar13 + 2] << 0x10);
            uVar6 = (ulong)pbVar12[lVar13];
            goto LAB_00115612;
          case 3:
            uVar6 = (ulong)*(uint *)(pbVar12 + lVar13);
            break;
          case 4:
            uVar3 = *(uint *)(pbVar12 + lVar13);
            uVar6 = (ulong)pbVar12[lVar13 + 4];
            goto LAB_001155f0;
          case 5:
            uVar3 = *(uint *)(pbVar12 + lVar13);
            uVar6 = (ulong)*(ushort *)(pbVar12 + lVar13 + 4);
LAB_001155f0:
            uVar6 = uVar6 << 0x20 | (ulong)uVar3;
            break;
          case 6:
            uVar11 = (ulong)CONCAT12(pbVar12[lVar13 + 6],*(undefined2 *)(pbVar12 + lVar13 + 4)) <<
                     0x20;
            uVar6 = (ulong)*(uint *)(pbVar12 + lVar13);
LAB_00115612:
            uVar6 = uVar6 | uVar11;
            break;
          case 7:
            uVar6 = *(ulong *)(pbVar12 + lVar13);
            break;
          default:
            uVar6 = 0;
          }
          if (uVar6 != (long)ptr_00 - (long)ptr) {
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            msg = "Array index table is wrong";
            goto LAB_00115688;
          }
          uVar6 = (ulong)"\x01\x01"[*ptr_00];
          local_38 = ptr_00;
          if (uVar6 == 0) {
            uVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&local_38,ptr_00);
          }
          uVar14 = uVar14 + 1;
        }
        if (uVar14 == uVar9) {
          return;
        }
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array has more items than in index";
      }
    }
    else {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array padding is invalid";
    }
  }
LAB_00115688:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedArray(uint8_t const* ptr, std::size_t length) {
  // Array with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x06U);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x09U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = ptr + 1 + byteSizeLength;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);
    ValueLength offset = readIntegerNonEmpty<ValueLength>(
        indexTable + actualNrItems * byteSizeLength, byteSizeLength);
    if (offset != static_cast<ValueLength>(member - ptr)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is wrong");
    }

    member += Slice(member).byteSize();
    ++actualNrItems;
  }

  if (actualNrItems != nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array has more items than in index");
  }
}